

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O0

time_t retry_get_tick_seconds(RETRY_CONTROL_INSTANCE *retry_control)

{
  int iVar1;
  tickcounter_ms_t local_28;
  tickcounter_ms_t tick;
  ulong uStack_18;
  int tick_result;
  time_t result;
  RETRY_CONTROL_INSTANCE *retry_control_local;
  
  uStack_18 = 0xffffffffffffffff;
  local_28 = 0;
  if ((((retry_control != (RETRY_CONTROL_INSTANCE *)0x0) &&
       (retry_control->tick_counter != (TICK_COUNTER_HANDLE)0x0)) &&
      (result = (time_t)retry_control,
      iVar1 = tickcounter_get_current_ms(retry_control->tick_counter,&local_28), iVar1 == 0)) &&
     (local_28 != 0xffffffffffffffff)) {
    uStack_18 = local_28 / 1000;
  }
  return uStack_18;
}

Assistant:

static time_t retry_get_tick_seconds(RETRY_CONTROL_INSTANCE* retry_control)
{
    time_t result = INDEFINITE_TIME;
    int tick_result;
    tickcounter_ms_t tick = 0;

    if (retry_control != NULL && retry_control->tick_counter != NULL)
    {
        tick_result = tickcounter_get_current_ms(retry_control->tick_counter, &tick);
        if (tick_result == 0 && INDEFINITE_TIME != tick)
        {
            // convert tick ms into secs
            result = (time_t)(tick / 1000); 
        }
    }

    return result;
}